

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_file.c
# Opt level: O3

void test_open_file(void)

{
  int iVar1;
  mode_t mVar2;
  FILE *pFVar3;
  archive *paVar4;
  archive_entry *paVar5;
  la_ssize_t lVar6;
  time_t tVar7;
  long v2;
  char *pcVar8;
  la_int64_t lVar9;
  char buff [64];
  archive_entry *local_80;
  undefined1 local_78 [72];
  
  pFVar3 = fopen("test.7z","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                   ,L'#',(uint)(pFVar3 != (FILE *)0x0),"f != NULL",(void *)0x0);
  if (pFVar3 != (FILE *)0x0) {
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                     ,L'(',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_7zip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L')',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",paVar4);
    iVar1 = archive_write_add_filter_none(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar4);
    iVar1 = archive_write_open_FILE(paVar4,(FILE *)pFVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_open_FILE(a, f)",paVar4);
    paVar5 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                     ,L'0',(uint)(paVar5 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime(paVar5,1,0);
    archive_entry_copy_pathname(paVar5,"file");
    archive_entry_set_mode(paVar5,0x81ed);
    archive_entry_set_size(paVar5,8);
    iVar1 = archive_write_header(paVar4,paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    archive_entry_free(paVar5);
    lVar6 = archive_write_data(paVar4,"12345678",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'7',8,"8",lVar6,"archive_write_data(a, \"12345678\", 9)",paVar4);
    paVar5 = archive_entry_new();
    local_80 = paVar5;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                     ,L'<',(uint)(paVar5 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar5,"file2");
    archive_entry_set_mode(paVar5,0x81ed);
    archive_entry_set_size(paVar5,0xc8000);
    iVar1 = archive_write_header(paVar4,paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    archive_entry_free(paVar5);
    iVar1 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
    iVar1 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                        ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    fclose(pFVar3);
    pFVar3 = fopen("test.7z","rb");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                     ,L'M',(uint)(pFVar3 != (FILE *)0x0),"f != NULL",(void *)0x0);
    if (pFVar3 != (FILE *)0x0) {
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                       ,L'P',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar4);
      iVar1 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'R',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar1 = archive_read_open_FILE(paVar4,(FILE *)pFVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'S',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_FILE(a, f)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      tVar7 = archive_entry_mtime(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'V',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'W',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      tVar7 = archive_entry_atime(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'X',0,"0",tVar7,"archive_entry_atime(ae)",(void *)0x0);
      tVar7 = archive_entry_ctime(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'Y',0,"0",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
      pcVar8 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                 ,L'Z',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode(local_80);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                       ,L'[',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar9 = archive_entry_size(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'\\',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
      lVar6 = archive_read_data(paVar4,local_78,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L']',8,"8",lVar6,"archive_read_data(a, buff, 10)",paVar4);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'^',local_78,"buff","12345678","\"12345678\"",8,"8",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar8 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                 ,L'a',"file2","\"file2\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode(local_80);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                       ,L'b',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar9 = archive_entry_size(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'c',0xc8000,"819200",lVar9,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_data_skip(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_read_data_skip(a)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'g',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
      iVar1 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_file.c"
                          ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      fclose(pFVar3);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_open_file)
{
	char buff[64];
	struct archive_entry *ae;
	struct archive *a;
	FILE *f;

	f = fopen("test.7z", "wb");
	assert(f != NULL);
	if (f == NULL)
		return;

	/* Write an archive through this FILE *. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_7zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_FILE(a, f));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * Write a second file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 819200);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	fclose(f);

	/*
	 * Now, read the data back. 7z requiring seeking, that also
	 * tests that the seeking support works.
	 */
	f = fopen("test.7z", "rb");
	assert(f != NULL);
	if (f == NULL)
		return;
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_FILE(a, f));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff, 10));
	assertEqualMem(buff, "12345678", 8);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(819200, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	fclose(f);
}